

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.h
# Opt level: O0

void __thiscall
FSectorTagIterator::FSectorTagIterator(FSectorTagIterator *this,int tag,line_t *line)

{
  int local_2c;
  line_t *line_local;
  int tag_local;
  FSectorTagIterator *this_local;
  
  if (tag == 0) {
    this->searchtag = -0x80000000;
    if ((line == (line_t *)0x0) || (line->backsector == (sector_t *)0x0)) {
      local_2c = -1;
    }
    else {
      local_2c = (int)(((long)line->backsector - (long)sectors) / 0x268);
    }
    this->start = local_2c;
  }
  else {
    this->searchtag = tag;
    this->start = tagManager.TagHashFirst[tag & 0xff];
  }
  return;
}

Assistant:

FSectorTagIterator(int tag, line_t *line)
	{
		if (tag == 0)
		{
			searchtag = INT_MIN;
			start = (line == NULL || line->backsector == NULL)? -1 : (int)(line->backsector - sectors);
		}
		else
		{
			searchtag = tag;
			start = tagManager.TagHashFirst[((unsigned int)tag) % FTagManager::TAG_HASH_SIZE];
		}
	}